

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O0

void __thiscall CCommandManager::CCommandManager(CCommandManager *this)

{
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *in_RDI;
  
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::array
            ((array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *)
             0x12663c);
  in_RDI[1].list = (CCommand *)0x0;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear(in_RDI);
  return;
}

Assistant:

CCommandManager()
    {
        m_pConsole = 0;
        m_aCommands.clear();
    }